

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  int iVar1;
  size_t capacity;
  Type TVar2;
  _Base_ptr p_Var3;
  Array<kj::ReadableDirectory::Entry> *result;
  _Rb_tree_header *p_Var4;
  DebugExpression<bool> _kjCondition;
  ArrayBuilder<kj::ReadableDirectory::Entry> builder;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  DebugExpression<bool> local_81;
  Fault local_80;
  Entry *local_78;
  Entry *local_70;
  Entry *local_68;
  ArrayDisposer *local_60;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_58;
  Impl *local_50;
  Type local_48;
  String local_40;
  
  this_00 = &this->impl;
  local_78 = (Entry *)((ulong)local_78 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex);
  local_50 = &(this->impl).value;
  capacity = (this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_58 = this_00;
  local_78 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x20,0,capacity,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
  local_68 = local_78 + capacity;
  local_60 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  p_Var3 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var4 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
  local_70 = local_78;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      iVar1 = *(int *)&p_Var3[2]._M_parent;
      if (iVar1 == 1) {
        TVar2 = FILE;
      }
      else {
        TVar2 = SYMLINK;
        if (iVar1 != 3) {
          local_81.value = iVar1 == 2;
          if (!local_81.value) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      (&local_80,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x3ff,FAILED,"e.second.node.is<DirectoryNode>()","_kjCondition,",&local_81);
            kj::_::Debug::Fault::fatal(&local_80);
          }
          TVar2 = DIRECTORY;
        }
      }
      local_48 = TVar2;
      heapString(&local_40,*(char **)(p_Var3 + 1),
                 (size_t)((long)&p_Var3[1]._M_parent[-1]._M_right + 7));
      local_70->type = local_48;
      (local_70->name).content.ptr = local_40.content.ptr;
      (local_70->name).content.size_ = local_40.content.size_;
      (local_70->name).content.disposer = local_40.content.disposer;
      local_40.content.ptr = (char *)0x0;
      local_40.content.size_ = 0;
      local_70 = local_70 + 1;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  __return_storage_ptr__->ptr = local_78;
  __return_storage_ptr__->size_ = (long)local_70 - (long)local_78 >> 5;
  __return_storage_ptr__->disposer = local_60;
  kj::_::Mutex::unlock(&this_00->mutex,SHARED,(Waiter *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }